

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O2

int png_image_read_colormapped(png_voidp argument)

{
  png_imagep image;
  png_structrp png_ptr;
  png_inforp info_ptr;
  int iVar1;
  char *ptr;
  long lVar2;
  size_t size;
  png_voidp ptr_00;
  png_bytep row;
  long lVar3;
  png_uint_32 pVar4;
  bool bVar5;
  
  image = *argument;
  png_ptr = image->opaque->png_ptr;
  info_ptr = image->opaque->info_ptr;
  png_image_skip_unused_chunks(png_ptr);
  iVar1 = 0;
  if (*(int *)((long)argument + 0x48) == 0) {
    iVar1 = png_set_interlace_handling(png_ptr);
  }
  png_read_update_info(png_ptr,info_ptr);
  switch(*(undefined4 *)((long)argument + 0x48)) {
  case 0:
    if (((info_ptr->color_type == '\x03') || (info_ptr->color_type == '\0')) &&
       (info_ptr->bit_depth == '\b')) {
LAB_0010d30b:
      lVar2 = *(long *)((long)argument + 8);
      lVar3 = (long)*(int *)((long)argument + 0x10);
      if (lVar3 < 0) {
        lVar2 = lVar2 - (ulong)(image->height - 1) * lVar3;
      }
      *(long *)((long)argument + 0x30) = lVar2;
      *(long *)((long)argument + 0x38) = lVar3;
      if (iVar1 == 0) {
        size = png_get_rowbytes(png_ptr,info_ptr);
        ptr_00 = png_malloc(png_ptr,size);
        *(png_voidp *)((long)argument + 0x28) = ptr_00;
        iVar1 = png_safe_execute(image,png_image_read_and_map,argument);
        *(undefined8 *)((long)argument + 0x28) = 0;
        png_free(png_ptr,ptr_00);
      }
      else {
        while (0 < iVar1) {
          iVar1 = iVar1 + -1;
          pVar4 = image->height;
          row = *(png_bytep *)((long)argument + 0x30);
          while (bVar5 = pVar4 != 0, pVar4 = pVar4 - 1, bVar5) {
            png_read_row(png_ptr,row,(png_bytep)0x0);
            row = row + lVar3;
          }
        }
        iVar1 = 1;
      }
      return iVar1;
    }
    break;
  case 1:
  case 2:
    if (((info_ptr->color_type == '\x04') && (info_ptr->bit_depth == '\b')) &&
       ((png_ptr->screen_gamma == 220000 && (image->colormap_entries == 0x100)))) goto LAB_0010d30b;
    break;
  case 3:
    if (((info_ptr->color_type == '\x02') && (info_ptr->bit_depth == '\b')) &&
       ((png_ptr->screen_gamma == 220000 && (image->colormap_entries == 0xd8)))) goto LAB_0010d30b;
    break;
  case 4:
    if ((((info_ptr->color_type == '\x06') && (info_ptr->bit_depth == '\b')) &&
        (png_ptr->screen_gamma == 220000)) && (image->colormap_entries == 0xf4)) goto LAB_0010d30b;
  }
  png_error(png_ptr,"bad color-map processing (internal error)");
}

Assistant:

static int
png_image_read_colormapped(png_voidp argument)
{
   png_image_read_control *display = png_voidcast(png_image_read_control*,
       argument);
   png_imagep image = display->image;
   png_controlp control = image->opaque;
   png_structrp png_ptr = control->png_ptr;
   png_inforp info_ptr = control->info_ptr;

   int passes = 0; /* As a flag */

   PNG_SKIP_CHUNKS(png_ptr);

   /* Update the 'info' structure and make sure the result is as required; first
    * make sure to turn on the interlace handling if it will be required
    * (because it can't be turned on *after* the call to png_read_update_info!)
    */
   if (display->colormap_processing == PNG_CMAP_NONE)
      passes = png_set_interlace_handling(png_ptr);

   png_read_update_info(png_ptr, info_ptr);

   /* The expected output can be deduced from the colormap_processing option. */
   switch (display->colormap_processing)
   {
      case PNG_CMAP_NONE:
         /* Output must be one channel and one byte per pixel, the output
          * encoding can be anything.
          */
         if ((info_ptr->color_type == PNG_COLOR_TYPE_PALETTE ||
            info_ptr->color_type == PNG_COLOR_TYPE_GRAY) &&
            info_ptr->bit_depth == 8)
            break;

         goto bad_output;

      case PNG_CMAP_TRANS:
      case PNG_CMAP_GA:
         /* Output must be two channels and the 'G' one must be sRGB, the latter
          * can be checked with an exact number because it should have been set
          * to this number above!
          */
         if (info_ptr->color_type == PNG_COLOR_TYPE_GRAY_ALPHA &&
            info_ptr->bit_depth == 8 &&
            png_ptr->screen_gamma == PNG_GAMMA_sRGB &&
            image->colormap_entries == 256)
            break;

         goto bad_output;

      case PNG_CMAP_RGB:
         /* Output must be 8-bit sRGB encoded RGB */
         if (info_ptr->color_type == PNG_COLOR_TYPE_RGB &&
            info_ptr->bit_depth == 8 &&
            png_ptr->screen_gamma == PNG_GAMMA_sRGB &&
            image->colormap_entries == 216)
            break;

         goto bad_output;

      case PNG_CMAP_RGB_ALPHA:
         /* Output must be 8-bit sRGB encoded RGBA */
         if (info_ptr->color_type == PNG_COLOR_TYPE_RGB_ALPHA &&
            info_ptr->bit_depth == 8 &&
            png_ptr->screen_gamma == PNG_GAMMA_sRGB &&
            image->colormap_entries == 244 /* 216 + 1 + 27 */)
            break;

         goto bad_output;

      default:
      bad_output:
         png_error(png_ptr, "bad color-map processing (internal error)");
   }

   /* Now read the rows.  Do this here if it is possible to read directly into
    * the output buffer, otherwise allocate a local row buffer of the maximum
    * size libpng requires and call the relevant processing routine safely.
    */
   {
      png_voidp first_row = display->buffer;
      ptrdiff_t row_bytes = display->row_stride;

      /* The following expression is designed to work correctly whether it gives
       * a signed or an unsigned result.
       */
      if (row_bytes < 0)
      {
         char *ptr = png_voidcast(char*, first_row);
         ptr += (image->height-1) * (-row_bytes);
         first_row = png_voidcast(png_voidp, ptr);
      }

      display->first_row = first_row;
      display->row_bytes = row_bytes;
   }

   if (passes == 0)
   {
      int result;
      png_voidp row = png_malloc(png_ptr, png_get_rowbytes(png_ptr, info_ptr));

      display->local_row = row;
      result = png_safe_execute(image, png_image_read_and_map, display);
      display->local_row = NULL;
      png_free(png_ptr, row);

      return result;
   }

   else
   {
      png_alloc_size_t row_bytes = (png_alloc_size_t)display->row_bytes;

      while (--passes >= 0)
      {
         png_uint_32      y = image->height;
         png_bytep        row = png_voidcast(png_bytep, display->first_row);

         for (; y > 0; --y)
         {
            png_read_row(png_ptr, row, NULL);
            row += row_bytes;
         }
      }

      return 1;
   }
}